

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O0

bool __thiscall
cmBuildCommand::TwoArgsSignature
          (cmBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference name;
  char *pcVar3;
  ulong uVar4;
  cmGlobalGenerator *this_01;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  string makecommand;
  string configType;
  char *cacheValue;
  string *define;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmBuildCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"called with less than two arguments",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  else {
    name = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_20,0);
    pcVar3 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
    std::__cxx11::string::string((string *)(makecommand.field_2._M_local_buf + 8));
    bVar1 = cmsys::SystemTools::GetEnv
                      ("CMAKE_CONFIG_TYPE",(string *)(makecommand.field_2._M_local_buf + 8));
    if ((!bVar1) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0)) {
      std::__cxx11::string::operator=((string *)(makecommand.field_2._M_local_buf + 8),"Release");
    }
    this_01 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"",&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,"",&local_f1);
    bVar1 = cmMakefile::IgnoreErrorsCMP0061((this->super_cmCommand).Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              ((string *)local_a8,this_01,&local_c8,(string *)((long)&makecommand.field_2 + 8),
               &local_f0,bVar1);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    if (pcVar3 == (char *)0x0) {
      this_00 = (this->super_cmCommand).Makefile;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                (this_00,name,pcVar3,"Command used to build entire project from the command line.",
                 STRING,false);
    }
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)(makecommand.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmBuildCommand::TwoArgsSignature(std::vector<std::string> const& args)
{
  if (args.size() < 2) {
    this->SetError("called with less than two arguments");
    return false;
  }

  std::string const& define = args[0];
  const char* cacheValue = this->Makefile->GetDefinition(define);

  std::string configType;
  if (!cmSystemTools::GetEnv("CMAKE_CONFIG_TYPE", configType) ||
      configType.empty()) {
    configType = "Release";
  }

  std::string makecommand =
    this->Makefile->GetGlobalGenerator()->GenerateCMakeBuildCommand(
      "", configType, "", this->Makefile->IgnoreErrorsCMP0061());

  if (cacheValue) {
    return true;
  }
  this->Makefile->AddCacheDefinition(define, makecommand.c_str(),
                                     "Command used to build entire project "
                                     "from the command line.",
                                     cmStateEnums::STRING);
  return true;
}